

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-subfilter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ulong uVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  Mat test_image_copy;
  int j;
  uint i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sub_filters;
  Mat test_image_sized;
  Vec3b *pixel;
  int i;
  int z;
  Mat test_image;
  undefined5 in_stack_fffffffffffffd38;
  uchar in_stack_fffffffffffffd3d;
  uchar in_stack_fffffffffffffd3e;
  uchar in_stack_fffffffffffffd3f;
  _InputArray *in_stack_fffffffffffffd40;
  __atomic_base<int> *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd70;
  Mat local_278 [96];
  int local_218;
  uint local_214;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  Mat local_1f8 [96];
  Mat local_198 [96];
  Size_<int> local_138;
  undefined1 local_130 [24];
  _InputArray local_118;
  Mat local_100 [101];
  undefined2 local_9b;
  uchar local_99;
  Vec<unsigned_char,_3> *local_98;
  int local_8c;
  int local_88;
  Size_<int> local_78;
  Mat local_70 [8];
  int local_68;
  int local_64;
  int local_4;
  
  local_4 = 0;
  cv::Mat::Mat(local_70);
  cv::Size_<int>::Size_(&local_78,0x280,0x1e0);
  cv::Mat::create(local_70,&local_78,0x10);
  for (local_88 = 0; local_88 < local_68; local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < local_64; local_8c = local_8c + 1) {
      local_98 = cv::Mat::at<cv::Vec<unsigned_char,3>>(local_70,local_88,local_8c);
      rand();
      rand();
      rand();
      cv::Vec<unsigned_char,_3>::Vec
                ((Vec<unsigned_char,_3> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3f,
                 in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3d);
      *(undefined2 *)(local_98->super_Matx<unsigned_char,_3,_1>).val = local_9b;
      (local_98->super_Matx<unsigned_char,_3,_1>).val[2] = local_99;
    }
  }
  bVar1 = cv::Mat::empty();
  if ((bVar1 & 1) == 0) {
    cv::Mat::Mat(local_100);
    cv::_InputArray::_InputArray
              (in_stack_fffffffffffffd40,
               (Mat *)CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38
                                                ))));
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)in_stack_fffffffffffffd40,
               (Mat *)CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38
                                                ))));
    cv::Size_<int>::Size_(&local_138,0x280,0x1e0);
    cv::resize(0,&local_118,local_130,&local_138,1);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x1046f6);
    cv::_InputArray::~_InputArray(&local_118);
    ac::fill_filter_map();
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&ac::orig_frame,local_198);
    cv::Mat::~Mat(local_198);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)&blend_image,local_1f8);
    cv::Mat::~Mat(local_1f8);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1047a1);
    buildFilters((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(bVar1,in_stack_fffffffffffffd70));
    local_214 = 0;
    while( true ) {
      uVar2 = (ulong)local_214;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_210);
      if (sVar3 <= uVar2) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"Testing Filter: ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_210,(ulong)local_214);
      in_stack_fffffffffffffd50 = std::operator<<(poVar4,(string *)pvVar5);
      std::operator<<(in_stack_fffffffffffffd50,"\n");
      for (local_218 = 0; local_218 < 10; local_218 = local_218 + 1) {
        cv::Mat::clone();
        std::__atomic_base<int>::operator=
                  (in_stack_fffffffffffffd48,
                   (__int_type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_210,(ulong)local_214);
        ac::CallFilter((string *)pvVar5,local_278);
        cv::Mat::~Mat(local_278);
      }
      std::operator<<((ostream *)&std::cout,"Passed Test...\n");
      ac::release_all_objects();
      std::operator<<((ostream *)&std::cout,"Cleared Frames...\n");
      local_214 = local_214 + 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Passed ");
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_210);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    std::operator<<(poVar4," Image Filter Tests...\n");
    local_4 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd50);
    cv::Mat::~Mat(local_100);
    cv::Mat::~Mat(local_70);
    return local_4;
  }
  std::operator<<((ostream *)&std::cerr,"Error image could not be loaded.\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    cv::Mat test_image;
    test_image.create(cv::Size(640, 480), CV_8UC3);
    for(int z = 0; z < test_image.rows; ++z) {
        for(int i = 0; i < test_image.cols; ++i) {
            cv::Vec3b &pixel = test_image.at<cv::Vec3b>(z, i);
            pixel = cv::Vec3b(rand()%255, rand()%255, rand()%255);
        }
    }
    if(test_image.empty()) {
        std::cerr << "Error image could not be loaded.\n";
        exit(EXIT_FAILURE);
    }
    // setup test image
    cv::Mat test_image_sized;
    cv::resize(test_image, test_image_sized, cv::Size(640, 480));
    // initialize libacidcam
    ac::fill_filter_map();
    ac::orig_frame = test_image_sized.clone();
    blend_image = test_image_sized.clone();
    blend_set = true;
    // create vector of filters
    std::vector<std::string> sub_filters;
    // populate vector with image filters
    buildFilters(sub_filters);
    for(unsigned int i = 0; i < sub_filters.size(); ++i) {
        std::cout << "Testing Filter: " << sub_filters[i] << "\n";
        for(int j = 0; j < 10; ++j) {
            cv::Mat test_image_copy = test_image_sized.clone();
            ac::subfilter = 0;
            ac::CallFilter(sub_filters[i], test_image_copy);
        }
        std::cout << "Passed Test...\n";
        ac::release_all_objects();
        std::cout << "Cleared Frames...\n";
    }
    std::cout << "Passed " << sub_filters.size() << " Image Filter Tests...\n";
    return 0;
}